

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesOptionsWidget.cxx
# Opt level: O2

bool __thiscall
cmCursesOptionsWidget::HandleInput
          (cmCursesOptionsWidget *this,int *key,cmCursesMainForm *param_2,WINDOW *w)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = *key;
  if (iVar1 == 2) {
LAB_00136ce5:
    if (w == (WINDOW *)0x0) {
      uVar2 = 0xffffffffffffffff;
    }
    else {
      uVar2 = (ulong)((int)w->_maxy + 1);
    }
    wtouchln(w,0,uVar2,1);
    wrefresh(w);
    PreviousOption(this);
  }
  else {
    if ((iVar1 != 6) && (iVar1 != 0x157)) {
      if (iVar1 == 0x104) goto LAB_00136ce5;
      if ((iVar1 != 0x105) && (iVar1 != 10)) {
        return false;
      }
    }
    NextOption(this);
    if (w == (WINDOW *)0x0) {
      uVar2 = 0xffffffffffffffff;
    }
    else {
      uVar2 = (ulong)((int)w->_maxy + 1);
    }
    wtouchln(w,0,uVar2,1);
    wrefresh(w);
  }
  return true;
}

Assistant:

bool cmCursesOptionsWidget::HandleInput(int& key, cmCursesMainForm* /*fm*/,
                                        WINDOW* w)
{
  switch (key) {
    case 10: // 10 == enter
    case KEY_ENTER:
      this->NextOption();
      touchwin(w);
      wrefresh(w);
      return true;
    case KEY_LEFT:
    case ctrl('b'):
      touchwin(w);
      wrefresh(w);
      this->PreviousOption();
      return true;
    case KEY_RIGHT:
    case ctrl('f'):
      this->NextOption();
      touchwin(w);
      wrefresh(w);
      return true;
    default:
      return false;
  }
}